

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::RepeatedPrimitive::GenerateMergingCode
          (RepeatedPrimitive *this,Printer *p)

{
  allocator<char> local_131;
  char *local_130;
  size_type local_128;
  char local_120 [8];
  undefined8 uStack_118;
  anon_class_8_1_54a39810_for_cb body;
  Printer *p_local;
  undefined1 local_100 [64];
  __index_type local_c0;
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  bool local_98;
  bool local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  local_48._M_unused._M_object = &p_local;
  body.p = (Printer **)local_48._M_unused._0_8_;
  p_local = p;
  if ((this->super_FieldGeneratorBase).should_split_ == false) {
    anon_func::anon_class_16_2_40fd6f3e::anon_class_8_1_54a39810_for_cb::operator()(&body);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"body",&local_131);
    local_100._8_8_ = local_128;
    local_100._0_8_ = local_100 + 0x10;
    if (local_130 == local_120) {
      local_100._24_8_ = uStack_118;
    }
    else {
      local_100._0_8_ = local_130;
    }
    local_128 = 0;
    local_120[0] = '\0';
    local_48._8_8_ = 0;
    local_30 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
               ::_M_manager;
    local_130 = local_120;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              ((variant<std::__cxx11::string,std::function<bool()>> *)(local_100 + 0x20),
               (function<bool_()> *)&local_48);
    std::_Function_base::~_Function_base((_Function_base *)&local_48);
    local_b8._M_p = (pointer)&local_a8;
    local_b0 = 0;
    local_a8._M_local_buf[0] = '\0';
    local_98 = false;
    if (local_c0 == '\x01') {
      std::__cxx11::string::assign((char *)&local_b8);
    }
    local_50 = false;
    io::Printer::Emit(p,local_100,1,0x4d,
                      "\n        if (!from.$field_$.IsDefault()) {\n          $body$;\n        }\n      "
                     );
    io::Printer::Sub::~Sub((Sub *)local_100);
    std::__cxx11::string::~string((string *)&local_130);
  }
  return;
}

Assistant:

void GenerateMergingCode(io::Printer* p) const override {
    // TODO: experiment with simplifying this to be
    // `if (!from.empty()) { body(); }` for both split and non-split cases.
    auto body = [&] {
      p->Emit(R"cc(
        _this->_internal_mutable_$name$()->MergeFrom(from._internal_$name$());
      )cc");
    };
    if (!should_split()) {
      body();
    } else {
      p->Emit({{"body", body}}, R"cc(
        if (!from.$field_$.IsDefault()) {
          $body$;
        }
      )cc");
    }
  }